

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdIOCallback.cpp
# Opt level: O0

int __thiscall libebml::StdIOCallback::close(StdIOCallback *this,int __fd)

{
  int iVar1;
  ostream *this_00;
  CRTError *this_01;
  int *piVar2;
  string local_1c8;
  stringstream local_198 [8];
  stringstream Msg;
  ostream local_188 [376];
  StdIOCallback *local_10;
  StdIOCallback *this_local;
  
  if (this->File != (FILE *)0x0) {
    local_10 = this;
    iVar1 = fclose((FILE *)this->File);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(local_198);
      this_00 = std::operator<<(local_188,"Can\'t close file ");
      std::ostream::operator<<(this_00,this->File);
      this_01 = (CRTError *)__cxa_allocate_exception(0x18);
      std::__cxx11::stringstream::str();
      piVar2 = __errno_location();
      CRTError::CRTError(this_01,&local_1c8,*piVar2);
      __cxa_throw(this_01,&CRTError::typeinfo,CRTError::~CRTError);
    }
    this->File = (FILE *)0x0;
  }
  return (int)this;
}

Assistant:

void StdIOCallback::close()
{
  if(File==0)
    return;

  if(fclose(File)!=0) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"Can't close file "<<File;
    throw CRTError(Msg.str());
#endif // GCC2
  }

  File=0;
}